

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateFunctionAccess(ExpressionTranslateContext *ctx,ExprFunctionAccess *expression)

{
  Print(ctx,"(");
  TranslateTypeName(ctx,(expression->super_ExprBase).type);
  Print(ctx,")");
  Print(ctx,"__nullcMakeFunction(__nullcFR[%d], ",(ulong)expression->function->functionIndex);
  Translate(ctx,expression->context);
  Print(ctx,")");
  return;
}

Assistant:

void TranslateFunctionAccess(ExpressionTranslateContext &ctx, ExprFunctionAccess *expression)
{
	Print(ctx, "(");
	TranslateTypeName(ctx, expression->type);
	Print(ctx, ")");
	Print(ctx, "__nullcMakeFunction(__nullcFR[%d], ", expression->function->functionIndex);
	Translate(ctx, expression->context);
	Print(ctx, ")");
}